

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_170;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  ImportType local_118;
  reference local_d0;
  FuncType *func_type;
  Var local_a8;
  Location local_60;
  Enum local_40;
  Index local_3c;
  BinaryReaderInterp *pBStack_38;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderInterp *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  local_3c = import_index;
  pBStack_38 = this;
  GetLocation(&local_60,this);
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_a8,sig_index,(Location *)&func_type);
  local_40 = (Enum)SharedValidator::OnFunction(&this->validator_,&local_60,&local_a8);
  bVar2 = Failed((Result)local_40);
  Var::~Var(&local_a8);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Error);
  }
  else {
    local_d0 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->module_->func_types,(ulong)sig_index);
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_138,
               (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str,
               &local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_160,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_161);
    (*(local_d0->super_ExternType)._vptr_ExternType[2])(&local_170);
    ImportType::ImportType(&local_118,&local_138,&local_160,&local_170);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_118);
    ImportDesc::~ImportDesc((ImportDesc *)&local_118);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_170);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,local_d0);
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  }
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        std::string_view module_name,
                                        std::string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}